

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

ptls_iovec_t ptls_iovec_init(void *p,size_t len)

{
  ptls_iovec_t pVar1;
  size_t len_local;
  void *p_local;
  ptls_iovec_t r;
  
  pVar1.len = len;
  pVar1.base = (uint8_t *)p;
  return pVar1;
}

Assistant:

inline ptls_iovec_t ptls_iovec_init(const void *p, size_t len)
{
    /* avoid the "return (ptls_iovec_t){(uint8_t *)p, len};" construct because it requires C99
     * and triggers a warning "C4204: nonstandard extension used: non-constant aggregate initializer"
     * in Visual Studio */
    ptls_iovec_t r;
    r.base = (uint8_t *)p;
    r.len = len;
    return r;
}